

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_variables.c
# Opt level: O1

ngx_stream_regex_t * ngx_stream_regex_compile(ngx_conf_t *cf,ngx_regex_compile_t *rc)

{
  long lVar1;
  ulong uVar2;
  ngx_int_t nVar3;
  ngx_stream_regex_t *pnVar4;
  ulong uVar5;
  ngx_stream_regex_variable_t *pnVar6;
  ngx_stream_variable_t *pnVar7;
  u_char *puVar8;
  ngx_int_t *pnVar9;
  undefined1 local_58 [8];
  ngx_str_t name;
  ngx_uint_t local_40;
  
  rc->pool = cf->pool;
  nVar3 = ngx_regex_compile(rc);
  if (nVar3 != 0) {
    ngx_conf_log_error(1,cf,0,"%V",&rc->err);
    return (ngx_stream_regex_t *)0x0;
  }
  pnVar4 = (ngx_stream_regex_t *)ngx_pcalloc(cf->pool,0x30);
  if (pnVar4 != (ngx_stream_regex_t *)0x0) {
    pnVar4->regex = rc->regex;
    uVar5 = (ulong)rc->captures;
    pnVar4->ncaptures = uVar5;
    puVar8 = (rc->pattern).data;
    (pnVar4->name).len = (rc->pattern).len;
    (pnVar4->name).data = puVar8;
    lVar1 = *(long *)(*cf->ctx + ngx_stream_core_module.ctx_index * 8);
    uVar2 = *(ulong *)(lVar1 + 0xb8);
    if (uVar5 < uVar2) {
      uVar5 = uVar2;
    }
    *(ulong *)(lVar1 + 0xb8) = uVar5;
    local_40 = (ngx_uint_t)rc->named_captures;
    if (local_40 == 0) {
      return pnVar4;
    }
    pnVar6 = (ngx_stream_regex_variable_t *)ngx_palloc(rc->pool,local_40 << 4);
    if (pnVar6 != (ngx_stream_regex_variable_t *)0x0) {
      pnVar4->variables = pnVar6;
      pnVar4->nvariables = local_40;
      name.data = (u_char *)(long)rc->name_size;
      puVar8 = rc->names + 2;
      pnVar9 = &pnVar6->index;
      while( true ) {
        ((ngx_stream_regex_variable_t *)(pnVar9 + -1))->capture =
             (ulong)((uint)puVar8[-2] * 0x200 + (uint)puVar8[-1] * 2);
        name.len = (size_t)puVar8;
        local_58 = (undefined1  [8])strlen((char *)puVar8);
        pnVar7 = ngx_stream_add_variable(cf,(ngx_str_t *)local_58,1);
        if (pnVar7 == (ngx_stream_variable_t *)0x0) break;
        nVar3 = ngx_stream_get_variable_index(cf,(ngx_str_t *)local_58);
        *pnVar9 = nVar3;
        if (nVar3 == -1) {
          return (ngx_stream_regex_t *)0x0;
        }
        pnVar7->get_handler = ngx_stream_variable_not_found;
        puVar8 = puVar8 + (long)name.data;
        pnVar9 = pnVar9 + 2;
        local_40 = local_40 - 1;
        if (local_40 == 0) {
          return pnVar4;
        }
      }
    }
  }
  return (ngx_stream_regex_t *)0x0;
}

Assistant:

ngx_stream_regex_t *
ngx_stream_regex_compile(ngx_conf_t *cf, ngx_regex_compile_t *rc)
{
    u_char                       *p;
    size_t                        size;
    ngx_str_t                     name;
    ngx_uint_t                    i, n;
    ngx_stream_variable_t        *v;
    ngx_stream_regex_t           *re;
    ngx_stream_regex_variable_t  *rv;
    ngx_stream_core_main_conf_t  *cmcf;

    rc->pool = cf->pool;

    if (ngx_regex_compile(rc) != NGX_OK) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "%V", &rc->err);
        return NULL;
    }

    re = ngx_pcalloc(cf->pool, sizeof(ngx_stream_regex_t));
    if (re == NULL) {
        return NULL;
    }

    re->regex = rc->regex;
    re->ncaptures = rc->captures;
    re->name = rc->pattern;

    cmcf = ngx_stream_conf_get_module_main_conf(cf, ngx_stream_core_module);
    cmcf->ncaptures = ngx_max(cmcf->ncaptures, re->ncaptures);

    n = (ngx_uint_t) rc->named_captures;

    if (n == 0) {
        return re;
    }

    rv = ngx_palloc(rc->pool, n * sizeof(ngx_stream_regex_variable_t));
    if (rv == NULL) {
        return NULL;
    }

    re->variables = rv;
    re->nvariables = n;

    size = rc->name_size;
    p = rc->names;

    for (i = 0; i < n; i++) {
        rv[i].capture = 2 * ((p[0] << 8) + p[1]);

        name.data = &p[2];
        name.len = ngx_strlen(name.data);

        v = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
        if (v == NULL) {
            return NULL;
        }

        rv[i].index = ngx_stream_get_variable_index(cf, &name);
        if (rv[i].index == NGX_ERROR) {
            return NULL;
        }

        v->get_handler = ngx_stream_variable_not_found;

        p += size;
    }

    return re;
}